

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineparser.cpp
# Opt level: O0

QStringList * __thiscall QCommandLineParser::optionNames(QCommandLineParser *this)

{
  QCommandLineParserPrivate *in_RSI;
  QStringList *in_RDI;
  QStringList *this_00;
  
  this_00 = in_RDI;
  QCommandLineParserPrivate::checkParsed(in_RSI,(char *)0x6f2f27);
  QList<QString>::QList(this_00,(QList<QString> *)in_RSI);
  return in_RDI;
}

Assistant:

QStringList QCommandLineParser::optionNames() const
{
    d->checkParsed("optionNames");
    return d->optionNames;
}